

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O1

void __thiscall
QVariantAnimationPrivate::setCurrentValueForProgress(QVariantAnimationPrivate *this,qreal progress)

{
  QVariant *this_00;
  double dVar1;
  QObject *sender;
  PrivateShared *pPVar2;
  undefined8 uVar3;
  double dVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  QBasicAtomicInt QVar10;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 uStack_40;
  void *local_38;
  QVariant *pQStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  sender = (this->super_QAbstractAnimationPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  dVar1 = (this->currentInterval).start.first;
  dVar4 = progress - dVar1;
  local_58._16_4_ = 0xaaaaaaaa;
  local_58._20_4_ = 0xaaaaaaaa;
  uStack_40._0_4_ = 0xaaaaaaaa;
  uStack_40._4_4_ = 0xaaaaaaaa;
  local_58._0_4_ = 0xaaaaaaaa;
  local_58._4_4_ = 0xaaaaaaaa;
  local_58._8_4_ = 0xaaaaaaaa;
  local_58._12_4_ = 0xaaaaaaaa;
  (*sender->_vptr_QObject[0x11])
            (~-(uint)(dVar4 == 0.0) & SUB84(dVar4 / ((this->currentInterval).end.first - dVar1),0),
             &local_58,sender,&(this->currentInterval).start.second,
             &(this->currentInterval).end.second);
  this_00 = &this->currentValue;
  pPVar2 = (this->currentValue).d.data.shared;
  uVar3 = *(undefined8 *)&(this->currentValue).d.field_0x18;
  uVar5 = *(undefined4 *)((long)&(this->currentValue).d.data + 8);
  uVar6 = *(undefined4 *)((long)&(this->currentValue).d.data + 0xc);
  uVar7 = *(undefined4 *)((long)&(this->currentValue).d.data + 0x10);
  uVar8 = *(undefined4 *)((long)&(this->currentValue).d.data + 0x14);
  *(undefined4 *)((long)&(this->currentValue).d.data + 0x10) = local_58._16_4_;
  *(undefined4 *)((long)&(this->currentValue).d.data + 0x14) = local_58._20_4_;
  *(undefined4 *)&(this->currentValue).d.field_0x18 = (undefined4)uStack_40;
  *(undefined4 *)&(this->currentValue).d.field_0x1c = uStack_40._4_4_;
  *(undefined4 *)&(this->currentValue).d.data = local_58._0_4_;
  *(undefined4 *)((long)&(this->currentValue).d.data + 4) = local_58._4_4_;
  *(undefined4 *)((long)&(this->currentValue).d.data + 8) = local_58._8_4_;
  *(undefined4 *)((long)&(this->currentValue).d.data + 0xc) = local_58._12_4_;
  local_58.shared = pPVar2;
  local_58._8_4_ = uVar5;
  local_58._12_4_ = uVar6;
  local_58._16_4_ = uVar7;
  local_58._20_4_ = uVar8;
  uStack_40 = uVar3;
  (*sender->_vptr_QObject[0x10])(sender,this_00);
  if ((__atomic_base<int>)
      setCurrentValueForProgress::changedSignalIndex._q_value.super___atomic_base<int>._M_i ==
      (__atomic_base<int>)0x0) {
    QVar10._q_value.super___atomic_base<int>._M_i =
         (Type)QObjectPrivate::signalIndex
                         ((QObjectPrivate *)this,"valueChanged(QVariant)",(QMetaObject **)0x0);
    LOCK();
    if ((__atomic_base<int>)
        setCurrentValueForProgress::changedSignalIndex._q_value.super___atomic_base<int>._M_i !=
        (__atomic_base<int>)0x0) {
      QVar10 = setCurrentValueForProgress::changedSignalIndex;
    }
    setCurrentValueForProgress::changedSignalIndex._q_value.super___atomic_base<int>._M_i =
         QVar10._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
  }
  bVar9 = QObjectPrivate::isSignalConnected
                    ((QObjectPrivate *)this,
                     (uint)setCurrentValueForProgress::changedSignalIndex._q_value.
                           super___atomic_base<int>._M_i,true);
  if ((bVar9) && (bVar9 = ::QVariant::equals(this_00,(QVariant *)&local_58), !bVar9)) {
    local_38 = (void *)0x0;
    pQStack_30 = this_00;
    QMetaObject::activate(sender,&QVariantAnimation::staticMetaObject,0,&local_38);
  }
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QVariantAnimationPrivate::setCurrentValueForProgress(const qreal progress)
{
    Q_Q(QVariantAnimation);

    const qreal startProgress = currentInterval.start.first;
    const qreal endProgress = currentInterval.end.first;
    const qreal localProgress =
            qIsNull(progress - startProgress) ? 0.0 // avoid 0/0 below
            /* else */                        : (progress - startProgress) / (endProgress - startProgress);

    QVariant ret = q->interpolated(currentInterval.start.second,
                                   currentInterval.end.second,
                                   localProgress);
    qSwap(currentValue, ret);
    q->updateCurrentValue(currentValue);
    Q_CONSTINIT static QBasicAtomicInt changedSignalIndex = Q_BASIC_ATOMIC_INITIALIZER(0);
    if (!changedSignalIndex.loadRelaxed()) {
        //we keep the mask so that we emit valueChanged only when needed (for performance reasons)
        changedSignalIndex.testAndSetRelaxed(0, signalIndex("valueChanged(QVariant)"));
    }
    if (isSignalConnected(changedSignalIndex.loadRelaxed()) && currentValue != ret) {
        //the value has changed
        emit q->valueChanged(currentValue);
    }
}